

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O2

qint64 __thiscall
QNetworkReplyHttpImpl::readData(QNetworkReplyHttpImpl *this,char *data,qint64 maxlen)

{
  QDecompressHelper *this_00;
  QNetworkReplyHttpImplPrivate *this_01;
  bool bVar1;
  qint64 qVar2;
  qint64 qVar3;
  size_t in_RCX;
  size_t __n;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QNetworkReplyHttpImplPrivate **)(this + 8);
  if (this_01->cacheLoadDevice != (QIODevice *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      qVar2 = QIODevice::read((char *)this_01->cacheLoadDevice,(longlong)data);
      return qVar2;
    }
    goto LAB_001fd06d;
  }
  if (this_01->downloadZerocopyBuffer == (char *)0x0) {
    this_00 = &this_01->decompressHelper;
    bVar1 = QDecompressHelper::isValid(this_00);
    if (bVar1) {
      bVar1 = QDecompressHelper::hasData(this_00);
      if (!bVar1) {
        bVar1 = QNetworkReply::isFinished((QNetworkReply *)this);
        if (bVar1) goto LAB_001fcee9;
      }
      if (maxlen != 0) {
        bVar1 = QDecompressHelper::hasData(this_00);
        if (bVar1) {
          __n = QDecompressHelper::read(this_00,(int)data,(void *)maxlen,in_RCX);
          bVar1 = QDecompressHelper::isValid(this_00);
          if (!bVar1) {
            QCoreApplication::translate((char *)&local_68,"QHttp","Decompression failed: %1",0);
            QDecompressHelper::errorString((QString *)&local_80,this_00);
            QString::arg<QString,_true>
                      ((QString *)&local_50,(QString *)&local_68,(QString *)&local_80,0,(QChar)0x20)
            ;
            QNetworkReplyHttpImplPrivate::error(this_01,UnknownContentError,(QString *)&local_50);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
            QDecompressHelper::clear(this_00);
            goto LAB_001fcefb;
          }
          if (this_01->cacheSaveDevice != (QIODevice *)0x0) {
            QIODevice::write((char *)this_01->cacheSaveDevice,(longlong)data);
            bVar1 = QNetworkReply::isFinished((QNetworkReply *)this);
            if (bVar1) {
              bVar1 = QDecompressHelper::hasData(this_00);
              if (!bVar1) {
                QNetworkReplyHttpImplPrivate::completeCacheSave(this_01);
              }
            }
          }
          qVar2 = this_01->bytesBuffered;
          this_01->bytesBuffered = 0;
          qVar3 = QNetworkReply::readBufferSize((QNetworkReply *)this);
          if (qVar3 != 0) {
            readBufferFreed(this,qVar2);
          }
          goto LAB_001fcfc8;
        }
      }
    }
    else {
LAB_001fcee9:
      if (this_01->state - Finished < 2) {
LAB_001fcefb:
        __n = 0xffffffffffffffff;
        goto LAB_001fcfc8;
      }
      qVar2 = this_01->bytesBuffered;
      this_01->bytesBuffered = 0;
      qVar3 = QNetworkReply::readBufferSize((QNetworkReply *)this);
      if (qVar3 != 0) {
        readBufferFreed(this,qVar2);
      }
    }
    __n = 0;
  }
  else {
    __n = this_01->downloadBufferCurrentSize - this_01->downloadBufferReadPosition;
    if (maxlen <= (long)__n) {
      __n = maxlen;
    }
    memcpy(data,this_01->downloadZerocopyBuffer + this_01->downloadBufferReadPosition,__n);
    this_01->downloadBufferReadPosition = this_01->downloadBufferReadPosition + __n;
  }
LAB_001fcfc8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __n;
  }
LAB_001fd06d:
  __stack_chk_fail();
}

Assistant:

qint64 QNetworkReplyHttpImpl::readData(char* data, qint64 maxlen)
{
    Q_D(QNetworkReplyHttpImpl);

    // cacheload device
    if (d->cacheLoadDevice) {
        // FIXME bytesdownloaded, position etc?

        qint64 ret = d->cacheLoadDevice->read(data, maxlen);
        return ret;
    }

    // zerocopy buffer
    if (d->downloadZerocopyBuffer) {
        // FIXME bytesdownloaded, position etc?

        qint64 howMuch = qMin(maxlen, (d->downloadBufferCurrentSize - d->downloadBufferReadPosition));
        memcpy(data, d->downloadZerocopyBuffer + d->downloadBufferReadPosition, howMuch);
        d->downloadBufferReadPosition += howMuch;
        return howMuch;

    }

    if (d->decompressHelper.isValid() && (d->decompressHelper.hasData() || !isFinished())) {
        if (maxlen == 0 || !d->decompressHelper.hasData())
            return 0;
        const qint64 bytesRead = d->decompressHelper.read(data, maxlen);
        if (!d->decompressHelper.isValid()) {
            d->error(QNetworkReplyImpl::NetworkError::UnknownContentError,
                     QCoreApplication::translate("QHttp", "Decompression failed: %1")
                             .arg(d->decompressHelper.errorString()));
            d->decompressHelper.clear();
            return -1;
        }
        if (d->cacheSaveDevice) {
            // Need to write to the cache now that we have the data
            d->cacheSaveDevice->write(data, bytesRead);
            // ... and if we've read everything then the cache can be closed.
            if (isFinished() && !d->decompressHelper.hasData())
                d->completeCacheSave();
        }
        // In case of buffer size restriction we need to emit that it has been emptied
        qint64 wasBuffered = d->bytesBuffered;
        d->bytesBuffered = 0;
        if (readBufferSize())
            emit readBufferFreed(wasBuffered);
        return bytesRead;
    }

    // normal buffer
    if (d->state == d->Finished || d->state == d->Aborted)
        return -1;

    qint64 wasBuffered = d->bytesBuffered;
    d->bytesBuffered = 0;
    if (readBufferSize())
        emit readBufferFreed(wasBuffered);
    return 0;
}